

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O0

void __thiscall
flatbuffers::rust::RustGenerator::GenStruct(RustGenerator *this,StructDef *struct_def)

{
  StructDef *pSVar1;
  Value *pVVar2;
  char *__s;
  bool local_109a;
  allocator<char> local_1099;
  string local_1098;
  allocator<char> local_1071;
  string local_1070;
  allocator<char> local_1049;
  string local_1048;
  allocator<char> local_1021;
  string local_1020;
  anon_class_8_1_8991fb9c local_1000;
  function<void_(const_flatbuffers::FieldDef_&)> local_ff8;
  allocator<char> local_fd1;
  string local_fd0;
  allocator<char> local_fa9;
  string local_fa8;
  allocator<char> local_f81;
  string local_f80;
  allocator<char> local_f59;
  string local_f58;
  anon_class_8_1_8991fb9c local_f38;
  function<void_(const_flatbuffers::FieldDef_&)> local_f30;
  allocator<char> local_f09;
  string local_f08;
  allocator<char> local_ee1;
  string local_ee0;
  allocator<char> local_eb9;
  string local_eb8;
  allocator<char> local_e91;
  string local_e90;
  allocator<char> local_e69;
  string local_e68;
  allocator<char> local_e41;
  string local_e40;
  anon_class_8_1_8991fb9c local_e20;
  function<void_(const_flatbuffers::FieldDef_&)> local_e18;
  allocator<char> local_df1;
  string local_df0;
  allocator<char> local_dc9;
  string local_dc8;
  string local_da8;
  allocator<char> local_d81;
  string local_d80;
  anon_class_8_1_8991fb9c local_d60;
  function<void_(const_flatbuffers::FieldDef_&)> local_d58;
  allocator<char> local_d31;
  string local_d30;
  allocator<char> local_d09;
  string local_d08;
  allocator<char> local_ce1;
  string local_ce0;
  anon_class_8_1_8991fb9c local_cc0;
  function<void_(const_flatbuffers::FieldDef_&)> local_cb8;
  allocator<char> local_c91;
  string local_c90;
  allocator<char> local_c69;
  string local_c68;
  anon_class_8_1_8991fb9c local_c48;
  function<void_(const_flatbuffers::FieldDef_&)> local_c40;
  allocator<char> local_c19;
  string local_c18;
  allocator<char> local_bf1;
  string local_bf0;
  allocator<char> local_bc9;
  string local_bc8;
  allocator<char> local_ba1;
  string local_ba0;
  allocator<char> local_b79;
  string local_b78;
  allocator<char> local_b51;
  string local_b50;
  allocator<char> local_b29;
  string local_b28;
  anon_class_8_1_8991fb9c local_b08;
  function<void_(const_flatbuffers::FieldDef_&)> local_b00;
  allocator<char> local_ad9;
  string local_ad8;
  allocator<char> local_ab1;
  string local_ab0;
  allocator<char> local_a89;
  string local_a88;
  allocator<char> local_a61;
  string local_a60;
  allocator<char> local_a39;
  string local_a38;
  allocator<char> local_a11;
  string local_a10;
  allocator<char> local_9e9;
  string local_9e8;
  string local_9c8;
  allocator<char> local_9a1;
  string local_9a0;
  size_type_conflict local_980;
  size_type_conflict numFields;
  string local_970;
  allocator<char> local_949;
  string local_948;
  allocator<char> local_921;
  string local_920;
  allocator<char> local_8f9;
  string local_8f8;
  allocator<char> local_8d1;
  string local_8d0;
  allocator<char> local_8a9;
  string local_8a8;
  allocator<char> local_881;
  string local_880;
  allocator<char> local_859;
  string local_858;
  allocator<char> local_831;
  string local_830;
  allocator<char> local_809;
  string local_808;
  allocator<char> local_7e1;
  string local_7e0;
  allocator<char> local_7b9;
  string local_7b8;
  allocator<char> local_791;
  string local_790;
  allocator<char> local_769;
  string local_768;
  allocator<char> local_741;
  string local_740;
  allocator<char> local_719;
  string local_718;
  allocator<char> local_6f1;
  string local_6f0;
  allocator<char> local_6c9;
  string local_6c8;
  allocator<char> local_6a1;
  string local_6a0;
  allocator<char> local_679;
  string local_678;
  allocator<char> local_651;
  string local_650;
  allocator<char> local_629;
  string local_628;
  allocator<char> local_601;
  string local_600;
  allocator<char> local_5d9;
  string local_5d8;
  allocator<char> local_5b1;
  string local_5b0;
  allocator<char> local_589;
  string local_588;
  allocator<char> local_561;
  string local_560;
  allocator<char> local_539;
  string local_538;
  allocator<char> local_511;
  string local_510;
  allocator<char> local_4e9;
  string local_4e8;
  allocator<char> local_4c1;
  string local_4c0;
  allocator<char> local_499;
  string local_498;
  allocator<char> local_471;
  string local_470;
  allocator<char> local_449;
  string local_448;
  allocator<char> local_421;
  string local_420;
  allocator<char> local_3f9;
  string local_3f8;
  allocator<char> local_3d1;
  string local_3d0;
  allocator<char> local_3a9;
  string local_3a8;
  anon_class_8_1_8991fb9c local_388;
  function<void_(const_flatbuffers::FieldDef_&)> local_380;
  allocator<char> local_359;
  string local_358;
  allocator<char> local_331;
  string local_330;
  allocator<char> local_309;
  string local_308;
  allocator<char> local_2e1;
  string local_2e0;
  allocator<char> local_2b9;
  string local_2b8;
  allocator<char> local_291;
  string local_290;
  allocator<char> local_269;
  string local_268;
  allocator<char> local_241;
  string local_240;
  allocator<char> local_219;
  string local_218;
  allocator<char> local_1f1;
  string local_1f0;
  allocator<char> local_1c9;
  string local_1c8;
  allocator<char> local_1a1;
  string local_1a0;
  string local_180;
  allocator<char> local_159;
  string local_158;
  string local_138;
  allocator<char> local_111;
  string local_110;
  string local_f0;
  allocator<char> local_c9;
  string local_c8;
  allocator<char> local_a1;
  string local_a0;
  allocator<char> local_79;
  string local_78;
  byte local_55;
  byte local_42;
  allocator<char> local_41;
  string local_40;
  byte local_19;
  StructDef *pSStack_18;
  bool is_private;
  StructDef *struct_def_local;
  RustGenerator *this_local;
  
  local_42 = 0;
  local_55 = 0;
  local_109a = false;
  pSStack_18 = struct_def;
  struct_def_local = (StructDef *)this;
  if (((((this->super_BaseGenerator).parser_)->opts).no_leak_private_annotations & 1U) != 0) {
    std::allocator<char>::allocator();
    local_42 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"private",&local_41);
    local_55 = 1;
    pVVar2 = SymbolTable<flatbuffers::Value>::Lookup
                       (&(struct_def->super_Definition).attributes,&local_40);
    local_109a = pVVar2 != (Value *)0x0;
  }
  if ((local_55 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_40);
  }
  if ((local_42 & 1) != 0) {
    std::allocator<char>::~allocator(&local_41);
  }
  local_19 = local_109a;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"ACCESS_TYPE",&local_79);
  __s = "pub";
  if ((local_19 & 1) != 0) {
    __s = "pub(crate)";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,__s,&local_a1);
  CodeWriter::SetValue(&this->code_,&local_78,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator(&local_a1);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  GenComment(this,&(pSStack_18->super_Definition).doc_comment,"");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_c8,"ALIGN",&local_c9);
  NumToString<unsigned_long>(&local_f0,pSStack_18->minalign);
  CodeWriter::SetValue(&this->code_,&local_c8,&local_f0);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator(&local_c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_110,"STRUCT_TY",&local_111);
  IdlNamer::Type_abi_cxx11_(&local_138,&this->namer_,pSStack_18);
  CodeWriter::SetValue(&this->code_,&local_110,&local_138);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_110);
  std::allocator<char>::~allocator(&local_111);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,"STRUCT_SIZE",&local_159);
  NumToString<unsigned_long>(&local_180,pSStack_18->bytesize);
  CodeWriter::SetValue(&this->code_,&local_158,&local_180);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_158);
  std::allocator<char>::~allocator(&local_159);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,"// struct {{STRUCT_TY}}, aligned to {{ALIGN}}",&local_1a1);
  CodeWriter::operator+=(&this->code_,&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::allocator<char>::~allocator(&local_1a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1c8,"#[repr(transparent)]",&local_1c9);
  CodeWriter::operator+=(&this->code_,&local_1c8);
  std::__cxx11::string::~string((string *)&local_1c8);
  std::allocator<char>::~allocator(&local_1c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"#[derive(Clone, Copy, PartialEq)]",&local_1f1);
  CodeWriter::operator+=(&this->code_,&local_1f0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::allocator<char>::~allocator(&local_1f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_218,"{{ACCESS_TYPE}} struct {{STRUCT_TY}}(pub [u8; {{STRUCT_SIZE}}]);"
             ,&local_219);
  CodeWriter::operator+=(&this->code_,&local_218);
  std::__cxx11::string::~string((string *)&local_218);
  std::allocator<char>::~allocator(&local_219);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"impl Default for {{STRUCT_TY}} { ",&local_241);
  CodeWriter::operator+=(&this->code_,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::allocator<char>::~allocator(&local_241);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_268,"  fn default() -> Self { ",&local_269);
  CodeWriter::operator+=(&this->code_,&local_268);
  std::__cxx11::string::~string((string *)&local_268);
  std::allocator<char>::~allocator(&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_290,"    Self([0; {{STRUCT_SIZE}}])",&local_291);
  CodeWriter::operator+=(&this->code_,&local_290);
  std::__cxx11::string::~string((string *)&local_290);
  std::allocator<char>::~allocator(&local_291);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"  }",&local_2b9);
  CodeWriter::operator+=(&this->code_,&local_2b8);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::allocator<char>::~allocator(&local_2b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2e0,"}",&local_2e1);
  CodeWriter::operator+=(&this->code_,&local_2e0);
  std::__cxx11::string::~string((string *)&local_2e0);
  std::allocator<char>::~allocator(&local_2e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_308,"impl core::fmt::Debug for {{STRUCT_TY}} {",&local_309);
  CodeWriter::operator+=(&this->code_,&local_308);
  std::__cxx11::string::~string((string *)&local_308);
  std::allocator<char>::~allocator(&local_309);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,
             "  fn fmt(&self, f: &mut core::fmt::Formatter) -> core::fmt::Result {",&local_331);
  CodeWriter::operator+=(&this->code_,&local_330);
  std::__cxx11::string::~string((string *)&local_330);
  std::allocator<char>::~allocator(&local_331);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,"    f.debug_struct(\"{{STRUCT_TY}}\")",&local_359);
  CodeWriter::operator+=(&this->code_,&local_358);
  std::__cxx11::string::~string((string *)&local_358);
  std::allocator<char>::~allocator(&local_359);
  pSVar1 = pSStack_18;
  local_388.this = this;
  std::function<void(flatbuffers::FieldDef_const&)>::
  function<flatbuffers::rust::RustGenerator::GenStruct(flatbuffers::StructDef_const&)::_lambda(flatbuffers::FieldDef_const&)_1_,void>
            ((function<void(flatbuffers::FieldDef_const&)> *)&local_380,&local_388);
  ForAllStructFields(this,pSVar1,&local_380);
  std::function<void_(const_flatbuffers::FieldDef_&)>::~function(&local_380);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3a8,"      .finish()",&local_3a9);
  CodeWriter::operator+=(&this->code_,&local_3a8);
  std::__cxx11::string::~string((string *)&local_3a8);
  std::allocator<char>::~allocator(&local_3a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3d0,"  }",&local_3d1);
  CodeWriter::operator+=(&this->code_,&local_3d0);
  std::__cxx11::string::~string((string *)&local_3d0);
  std::allocator<char>::~allocator(&local_3d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_3f8,"}",&local_3f9);
  CodeWriter::operator+=(&this->code_,&local_3f8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::allocator<char>::~allocator(&local_3f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_420,"",&local_421);
  CodeWriter::operator+=(&this->code_,&local_420);
  std::__cxx11::string::~string((string *)&local_420);
  std::allocator<char>::~allocator(&local_421);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_448,"impl flatbuffers::SimpleToVerifyInSlice for {{STRUCT_TY}} {}",
             &local_449);
  CodeWriter::operator+=(&this->code_,&local_448);
  std::__cxx11::string::~string((string *)&local_448);
  std::allocator<char>::~allocator(&local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_470,"impl<\'a> flatbuffers::Follow<\'a> for {{STRUCT_TY}} {",
             &local_471);
  CodeWriter::operator+=(&this->code_,&local_470);
  std::__cxx11::string::~string((string *)&local_470);
  std::allocator<char>::~allocator(&local_471);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_498,"  type Inner = &\'a {{STRUCT_TY}};",&local_499);
  CodeWriter::operator+=(&this->code_,&local_498);
  std::__cxx11::string::~string((string *)&local_498);
  std::allocator<char>::~allocator(&local_499);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c0,"  #[inline]",&local_4c1);
  CodeWriter::operator+=(&this->code_,&local_4c0);
  std::__cxx11::string::~string((string *)&local_4c0);
  std::allocator<char>::~allocator(&local_4c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_4e8,"  unsafe fn follow(buf: &\'a [u8], loc: usize) -> Self::Inner {",
             &local_4e9);
  CodeWriter::operator+=(&this->code_,&local_4e8);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::allocator<char>::~allocator(&local_4e9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_510,"    <&\'a {{STRUCT_TY}}>::follow(buf, loc)",&local_511);
  CodeWriter::operator+=(&this->code_,&local_510);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator(&local_511);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_538,"  }",&local_539);
  CodeWriter::operator+=(&this->code_,&local_538);
  std::__cxx11::string::~string((string *)&local_538);
  std::allocator<char>::~allocator(&local_539);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_560,"}",&local_561);
  CodeWriter::operator+=(&this->code_,&local_560);
  std::__cxx11::string::~string((string *)&local_560);
  std::allocator<char>::~allocator(&local_561);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_588,"impl<\'a> flatbuffers::Follow<\'a> for &\'a {{STRUCT_TY}} {",
             &local_589);
  CodeWriter::operator+=(&this->code_,&local_588);
  std::__cxx11::string::~string((string *)&local_588);
  std::allocator<char>::~allocator(&local_589);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_5b0,"  type Inner = &\'a {{STRUCT_TY}};",&local_5b1);
  CodeWriter::operator+=(&this->code_,&local_5b0);
  std::__cxx11::string::~string((string *)&local_5b0);
  std::allocator<char>::~allocator(&local_5b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_5d8,"  #[inline]",&local_5d9);
  CodeWriter::operator+=(&this->code_,&local_5d8);
  std::__cxx11::string::~string((string *)&local_5d8);
  std::allocator<char>::~allocator(&local_5d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_600,"  unsafe fn follow(buf: &\'a [u8], loc: usize) -> Self::Inner {",
             &local_601);
  CodeWriter::operator+=(&this->code_,&local_600);
  std::__cxx11::string::~string((string *)&local_600);
  std::allocator<char>::~allocator(&local_601);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_628,"    flatbuffers::follow_cast_ref::<{{STRUCT_TY}}>(buf, loc)",
             &local_629);
  CodeWriter::operator+=(&this->code_,&local_628);
  std::__cxx11::string::~string((string *)&local_628);
  std::allocator<char>::~allocator(&local_629);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_650,"  }",&local_651);
  CodeWriter::operator+=(&this->code_,&local_650);
  std::__cxx11::string::~string((string *)&local_650);
  std::allocator<char>::~allocator(&local_651);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_678,"}",&local_679);
  CodeWriter::operator+=(&this->code_,&local_678);
  std::__cxx11::string::~string((string *)&local_678);
  std::allocator<char>::~allocator(&local_679);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6a0,"impl<\'b> flatbuffers::Push for {{STRUCT_TY}} {",&local_6a1);
  CodeWriter::operator+=(&this->code_,&local_6a0);
  std::__cxx11::string::~string((string *)&local_6a0);
  std::allocator<char>::~allocator(&local_6a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6c8,"    type Output = {{STRUCT_TY}};",&local_6c9);
  CodeWriter::operator+=(&this->code_,&local_6c8);
  std::__cxx11::string::~string((string *)&local_6c8);
  std::allocator<char>::~allocator(&local_6c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_6f0,"    #[inline]",&local_6f1);
  CodeWriter::operator+=(&this->code_,&local_6f0);
  std::__cxx11::string::~string((string *)&local_6f0);
  std::allocator<char>::~allocator(&local_6f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_718,"    unsafe fn push(&self, dst: &mut [u8], _written_len: usize) {"
             ,&local_719);
  CodeWriter::operator+=(&this->code_,&local_718);
  std::__cxx11::string::~string((string *)&local_718);
  std::allocator<char>::~allocator(&local_719);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_740,
             "        let src = ::core::slice::from_raw_parts(self as *const {{STRUCT_TY}} as *const u8, Self::size());"
             ,&local_741);
  CodeWriter::operator+=(&this->code_,&local_740);
  std::__cxx11::string::~string((string *)&local_740);
  std::allocator<char>::~allocator(&local_741);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_768,"        dst.copy_from_slice(src);",&local_769);
  CodeWriter::operator+=(&this->code_,&local_768);
  std::__cxx11::string::~string((string *)&local_768);
  std::allocator<char>::~allocator(&local_769);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_790,"    }",&local_791);
  CodeWriter::operator+=(&this->code_,&local_790);
  std::__cxx11::string::~string((string *)&local_790);
  std::allocator<char>::~allocator(&local_791);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7b8,"}",&local_7b9);
  CodeWriter::operator+=(&this->code_,&local_7b8);
  std::__cxx11::string::~string((string *)&local_7b8);
  std::allocator<char>::~allocator(&local_7b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e0,"",&local_7e1);
  CodeWriter::operator+=(&this->code_,&local_7e0);
  std::__cxx11::string::~string((string *)&local_7e0);
  std::allocator<char>::~allocator(&local_7e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_808,"impl<\'a> flatbuffers::Verifiable for {{STRUCT_TY}} {",&local_809
            );
  CodeWriter::operator+=(&this->code_,&local_808);
  std::__cxx11::string::~string((string *)&local_808);
  std::allocator<char>::~allocator(&local_809);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_830,"  #[inline]",&local_831);
  CodeWriter::operator+=(&this->code_,&local_830);
  std::__cxx11::string::~string((string *)&local_830);
  std::allocator<char>::~allocator(&local_831);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_858,"  fn run_verifier(",&local_859);
  CodeWriter::operator+=(&this->code_,&local_858);
  std::__cxx11::string::~string((string *)&local_858);
  std::allocator<char>::~allocator(&local_859);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_880,"    v: &mut flatbuffers::Verifier, pos: usize",&local_881);
  CodeWriter::operator+=(&this->code_,&local_880);
  std::__cxx11::string::~string((string *)&local_880);
  std::allocator<char>::~allocator(&local_881);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a8,"  ) -> Result<(), flatbuffers::InvalidFlatbuffer> {",&local_8a9);
  CodeWriter::operator+=(&this->code_,&local_8a8);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::allocator<char>::~allocator(&local_8a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8d0,"    use self::flatbuffers::Verifiable;",&local_8d1);
  CodeWriter::operator+=(&this->code_,&local_8d0);
  std::__cxx11::string::~string((string *)&local_8d0);
  std::allocator<char>::~allocator(&local_8d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8f8,"    v.in_buffer::<Self>(pos)",&local_8f9);
  CodeWriter::operator+=(&this->code_,&local_8f8);
  std::__cxx11::string::~string((string *)&local_8f8);
  std::allocator<char>::~allocator(&local_8f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_920,"  }",&local_921);
  CodeWriter::operator+=(&this->code_,&local_920);
  std::__cxx11::string::~string((string *)&local_920);
  std::allocator<char>::~allocator(&local_921);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_948,"}",&local_949);
  CodeWriter::operator+=(&this->code_,&local_948);
  std::__cxx11::string::~string((string *)&local_948);
  std::allocator<char>::~allocator(&local_949);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_970,"",(allocator<char> *)((long)&numFields + 7));
  CodeWriter::operator+=(&this->code_,&local_970);
  std::__cxx11::string::~string((string *)&local_970);
  std::allocator<char>::~allocator((allocator<char> *)((long)&numFields + 7));
  if (((((this->super_BaseGenerator).parser_)->opts).rust_serialize & 1U) != 0) {
    local_980 = std::vector<flatbuffers::FieldDef_*,_std::allocator<flatbuffers::FieldDef_*>_>::size
                          (&(pSStack_18->fields).vec);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_9a0,"NUM_FIELDS",&local_9a1)
    ;
    NumToString<unsigned_long>(&local_9c8,local_980);
    CodeWriter::SetValue(&this->code_,&local_9a0,&local_9c8);
    std::__cxx11::string::~string((string *)&local_9c8);
    std::__cxx11::string::~string((string *)&local_9a0);
    std::allocator<char>::~allocator(&local_9a1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_9e8,"impl Serialize for {{STRUCT_TY}} {",&local_9e9);
    CodeWriter::operator+=(&this->code_,&local_9e8);
    std::__cxx11::string::~string((string *)&local_9e8);
    std::allocator<char>::~allocator(&local_9e9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a10,
               "  fn serialize<S>(&self, serializer: S) -> Result<S::Ok, S::Error>",&local_a11);
    CodeWriter::operator+=(&this->code_,&local_a10);
    std::__cxx11::string::~string((string *)&local_a10);
    std::allocator<char>::~allocator(&local_a11);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a38,"  where",&local_a39);
    CodeWriter::operator+=(&this->code_,&local_a38);
    std::__cxx11::string::~string((string *)&local_a38);
    std::allocator<char>::~allocator(&local_a39);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a60,"    S: Serializer,",&local_a61);
    CodeWriter::operator+=(&this->code_,&local_a60);
    std::__cxx11::string::~string((string *)&local_a60);
    std::allocator<char>::~allocator(&local_a61);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a88,"  {",&local_a89);
    CodeWriter::operator+=(&this->code_,&local_a88);
    std::__cxx11::string::~string((string *)&local_a88);
    std::allocator<char>::~allocator(&local_a89);
    if (local_980 == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ab0,
                 "    let s = serializer.serialize_struct(\"{{STRUCT_TY}}\", 0)?;",&local_ab1);
      CodeWriter::operator+=(&this->code_,&local_ab0);
      std::__cxx11::string::~string((string *)&local_ab0);
      std::allocator<char>::~allocator(&local_ab1);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_ad8,
                 "    let mut s = serializer.serialize_struct(\"{{STRUCT_TY}}\", {{NUM_FIELDS}})?;",
                 &local_ad9);
      CodeWriter::operator+=(&this->code_,&local_ad8);
      std::__cxx11::string::~string((string *)&local_ad8);
      std::allocator<char>::~allocator(&local_ad9);
    }
    pSVar1 = pSStack_18;
    local_b08.this = this;
    std::function<void(flatbuffers::FieldDef_const&)>::
    function<flatbuffers::rust::RustGenerator::GenStruct(flatbuffers::StructDef_const&)::_lambda(flatbuffers::FieldDef_const&)_2_,void>
              ((function<void(flatbuffers::FieldDef_const&)> *)&local_b00,&local_b08);
    ForAllStructFields(this,pSVar1,&local_b00);
    std::function<void_(const_flatbuffers::FieldDef_&)>::~function(&local_b00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_b28,"    s.end()",&local_b29);
    CodeWriter::operator+=(&this->code_,&local_b28);
    std::__cxx11::string::~string((string *)&local_b28);
    std::allocator<char>::~allocator(&local_b29);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b50,"  }",&local_b51);
    CodeWriter::operator+=(&this->code_,&local_b50);
    std::__cxx11::string::~string((string *)&local_b50);
    std::allocator<char>::~allocator(&local_b51);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b78,"}",&local_b79);
    CodeWriter::operator+=(&this->code_,&local_b78);
    std::__cxx11::string::~string((string *)&local_b78);
    std::allocator<char>::~allocator(&local_b79);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_ba0,"",&local_ba1);
    CodeWriter::operator+=(&this->code_,&local_ba0);
    std::__cxx11::string::~string((string *)&local_ba0);
    std::allocator<char>::~allocator(&local_ba1);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bc8,"impl<\'a> {{STRUCT_TY}} {",&local_bc9);
  CodeWriter::operator+=(&this->code_,&local_bc8);
  std::__cxx11::string::~string((string *)&local_bc8);
  std::allocator<char>::~allocator(&local_bc9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_bf0,"  #[allow(clippy::too_many_arguments)]",&local_bf1);
  CodeWriter::operator+=(&this->code_,&local_bf0);
  std::__cxx11::string::~string((string *)&local_bf0);
  std::allocator<char>::~allocator(&local_bf1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c18,"  pub fn new(",&local_c19);
  CodeWriter::operator+=(&this->code_,&local_c18);
  std::__cxx11::string::~string((string *)&local_c18);
  std::allocator<char>::~allocator(&local_c19);
  pSVar1 = pSStack_18;
  local_c48.this = this;
  std::function<void(flatbuffers::FieldDef_const&)>::
  function<flatbuffers::rust::RustGenerator::GenStruct(flatbuffers::StructDef_const&)::_lambda(flatbuffers::FieldDef_const&)_3_,void>
            ((function<void(flatbuffers::FieldDef_const&)> *)&local_c40,&local_c48);
  ForAllStructFields(this,pSVar1,&local_c40);
  std::function<void_(const_flatbuffers::FieldDef_&)>::~function(&local_c40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c68,"  ) -> Self {",&local_c69);
  CodeWriter::operator+=(&this->code_,&local_c68);
  std::__cxx11::string::~string((string *)&local_c68);
  std::allocator<char>::~allocator(&local_c69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c90,"    let mut s = Self([0; {{STRUCT_SIZE}}]);",&local_c91);
  CodeWriter::operator+=(&this->code_,&local_c90);
  std::__cxx11::string::~string((string *)&local_c90);
  std::allocator<char>::~allocator(&local_c91);
  pSVar1 = pSStack_18;
  local_cc0.this = this;
  std::function<void(flatbuffers::FieldDef_const&)>::
  function<flatbuffers::rust::RustGenerator::GenStruct(flatbuffers::StructDef_const&)::_lambda(flatbuffers::FieldDef_const&)_4_,void>
            ((function<void(flatbuffers::FieldDef_const&)> *)&local_cb8,&local_cc0);
  ForAllStructFields(this,pSVar1,&local_cb8);
  std::function<void_(const_flatbuffers::FieldDef_&)>::~function(&local_cb8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_ce0,"    s",&local_ce1);
  CodeWriter::operator+=(&this->code_,&local_ce0);
  std::__cxx11::string::~string((string *)&local_ce0);
  std::allocator<char>::~allocator(&local_ce1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d08,"  }",&local_d09);
  CodeWriter::operator+=(&this->code_,&local_d08);
  std::__cxx11::string::~string((string *)&local_d08);
  std::allocator<char>::~allocator(&local_d09);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d30,"",&local_d31);
  CodeWriter::operator+=(&this->code_,&local_d30);
  std::__cxx11::string::~string((string *)&local_d30);
  std::allocator<char>::~allocator(&local_d31);
  if (((((this->super_BaseGenerator).parser_)->opts).generate_name_strings & 1U) != 0) {
    GenFullyQualifiedNameGetter(this,pSStack_18,(string *)pSStack_18);
  }
  pSVar1 = pSStack_18;
  local_d60.this = this;
  std::function<void(flatbuffers::FieldDef_const&)>::
  function<flatbuffers::rust::RustGenerator::GenStruct(flatbuffers::StructDef_const&)::_lambda(flatbuffers::FieldDef_const&)_5_,void>
            ((function<void(flatbuffers::FieldDef_const&)> *)&local_d58,&local_d60);
  ForAllStructFields(this,pSVar1,&local_d58);
  std::function<void_(const_flatbuffers::FieldDef_&)>::~function(&local_d58);
  if (((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_d80,"STRUCT_OTY",&local_d81)
    ;
    IdlNamer::ObjectType_abi_cxx11_(&local_da8,&this->namer_,pSStack_18);
    CodeWriter::SetValue(&this->code_,&local_d80,&local_da8);
    std::__cxx11::string::~string((string *)&local_da8);
    std::__cxx11::string::~string((string *)&local_d80);
    std::allocator<char>::~allocator(&local_d81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_dc8,"  pub fn unpack(&self) -> {{STRUCT_OTY}} {",&local_dc9);
    CodeWriter::operator+=(&this->code_,&local_dc8);
    std::__cxx11::string::~string((string *)&local_dc8);
    std::allocator<char>::~allocator(&local_dc9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_df0,"    {{STRUCT_OTY}} {",&local_df1);
    CodeWriter::operator+=(&this->code_,&local_df0);
    std::__cxx11::string::~string((string *)&local_df0);
    std::allocator<char>::~allocator(&local_df1);
    pSVar1 = pSStack_18;
    local_e20.this = this;
    std::function<void(flatbuffers::FieldDef_const&)>::
    function<flatbuffers::rust::RustGenerator::GenStruct(flatbuffers::StructDef_const&)::_lambda(flatbuffers::FieldDef_const&)_6_,void>
              ((function<void(flatbuffers::FieldDef_const&)> *)&local_e18,&local_e20);
    ForAllStructFields(this,pSVar1,&local_e18);
    std::function<void_(const_flatbuffers::FieldDef_&)>::~function(&local_e18);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e40,"    }",&local_e41);
    CodeWriter::operator+=(&this->code_,&local_e40);
    std::__cxx11::string::~string((string *)&local_e40);
    std::allocator<char>::~allocator(&local_e41);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e68,"  }",&local_e69);
    CodeWriter::operator+=(&this->code_,&local_e68);
    std::__cxx11::string::~string((string *)&local_e68);
    std::allocator<char>::~allocator(&local_e69);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_e90,"}",&local_e91);
  CodeWriter::operator+=(&this->code_,&local_e90);
  std::__cxx11::string::~string((string *)&local_e90);
  std::allocator<char>::~allocator(&local_e91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_eb8,"",&local_eb9);
  CodeWriter::operator+=(&this->code_,&local_eb8);
  std::__cxx11::string::~string((string *)&local_eb8);
  std::allocator<char>::~allocator(&local_eb9);
  if (((((this->super_BaseGenerator).parser_)->opts).generate_object_based_api & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_ee0,"#[derive(Debug, Clone, PartialEq, Default)]",&local_ee1);
    CodeWriter::operator+=(&this->code_,&local_ee0);
    std::__cxx11::string::~string((string *)&local_ee0);
    std::allocator<char>::~allocator(&local_ee1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f08,"{{ACCESS_TYPE}} struct {{STRUCT_OTY}} {",&local_f09);
    CodeWriter::operator+=(&this->code_,&local_f08);
    std::__cxx11::string::~string((string *)&local_f08);
    std::allocator<char>::~allocator(&local_f09);
    pSVar1 = pSStack_18;
    local_f38.this = this;
    std::function<void(flatbuffers::FieldDef_const&)>::
    function<flatbuffers::rust::RustGenerator::GenStruct(flatbuffers::StructDef_const&)::_lambda(flatbuffers::FieldDef_const&)_7_,void>
              ((function<void(flatbuffers::FieldDef_const&)> *)&local_f30,&local_f38);
    ForAllStructFields(this,pSVar1,&local_f30);
    std::function<void_(const_flatbuffers::FieldDef_&)>::~function(&local_f30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_f58,"}",&local_f59);
    CodeWriter::operator+=(&this->code_,&local_f58);
    std::__cxx11::string::~string((string *)&local_f58);
    std::allocator<char>::~allocator(&local_f59);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f80,"impl {{STRUCT_OTY}} {",&local_f81);
    CodeWriter::operator+=(&this->code_,&local_f80);
    std::__cxx11::string::~string((string *)&local_f80);
    std::allocator<char>::~allocator(&local_f81);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_fa8,"  pub fn pack(&self) -> {{STRUCT_TY}} {",&local_fa9);
    CodeWriter::operator+=(&this->code_,&local_fa8);
    std::__cxx11::string::~string((string *)&local_fa8);
    std::allocator<char>::~allocator(&local_fa9);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_fd0,"    {{STRUCT_TY}}::new(",&local_fd1);
    CodeWriter::operator+=(&this->code_,&local_fd0);
    std::__cxx11::string::~string((string *)&local_fd0);
    std::allocator<char>::~allocator(&local_fd1);
    pSVar1 = pSStack_18;
    local_1000.this = this;
    std::function<void(flatbuffers::FieldDef_const&)>::
    function<flatbuffers::rust::RustGenerator::GenStruct(flatbuffers::StructDef_const&)::_lambda(flatbuffers::FieldDef_const&)_8_,void>
              ((function<void(flatbuffers::FieldDef_const&)> *)&local_ff8,&local_1000);
    ForAllStructFields(this,pSVar1,&local_ff8);
    std::function<void_(const_flatbuffers::FieldDef_&)>::~function(&local_ff8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1020,"    )",&local_1021);
    CodeWriter::operator+=(&this->code_,&local_1020);
    std::__cxx11::string::~string((string *)&local_1020);
    std::allocator<char>::~allocator(&local_1021);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1048,"  }",&local_1049);
    CodeWriter::operator+=(&this->code_,&local_1048);
    std::__cxx11::string::~string((string *)&local_1048);
    std::allocator<char>::~allocator(&local_1049);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1070,"}",&local_1071);
    CodeWriter::operator+=(&this->code_,&local_1070);
    std::__cxx11::string::~string((string *)&local_1070);
    std::allocator<char>::~allocator(&local_1071);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1098,"",&local_1099);
    CodeWriter::operator+=(&this->code_,&local_1098);
    std::__cxx11::string::~string((string *)&local_1098);
    std::allocator<char>::~allocator(&local_1099);
  }
  return;
}

Assistant:

void GenStruct(const StructDef &struct_def) {
    const bool is_private =
        parser_.opts.no_leak_private_annotations &&
        (struct_def.attributes.Lookup("private") != nullptr);
    code_.SetValue("ACCESS_TYPE", is_private ? "pub(crate)" : "pub");
    // Generates manual padding and alignment.
    // Variables are private because they contain little endian data on all
    // platforms.
    GenComment(struct_def.doc_comment);
    code_.SetValue("ALIGN", NumToString(struct_def.minalign));
    code_.SetValue("STRUCT_TY", namer_.Type(struct_def));
    code_.SetValue("STRUCT_SIZE", NumToString(struct_def.bytesize));

    // We represent Flatbuffers-structs in Rust-u8-arrays since the data may be
    // of the wrong endianness and alignment 1.
    //
    // PartialEq is useful to derive because we can correctly compare structs
    // for equality by just comparing their underlying byte data. This doesn't
    // hold for PartialOrd/Ord.
    code_ += "// struct {{STRUCT_TY}}, aligned to {{ALIGN}}";
    code_ += "#[repr(transparent)]";
    code_ += "#[derive(Clone, Copy, PartialEq)]";
    code_ += "{{ACCESS_TYPE}} struct {{STRUCT_TY}}(pub [u8; {{STRUCT_SIZE}}]);";
    code_ += "impl Default for {{STRUCT_TY}} { ";
    code_ += "  fn default() -> Self { ";
    code_ += "    Self([0; {{STRUCT_SIZE}}])";
    code_ += "  }";
    code_ += "}";

    // Debug for structs.
    code_ += "impl core::fmt::Debug for {{STRUCT_TY}} {";
    code_ +=
        "  fn fmt(&self, f: &mut core::fmt::Formatter"
        ") -> core::fmt::Result {";
    code_ += "    f.debug_struct(\"{{STRUCT_TY}}\")";
    ForAllStructFields(struct_def, [&](const FieldDef &unused) {
      (void)unused;
      code_ += "    .field(\"{{FIELD}}\", &self.{{FIELD}}())";
    });
    code_ += "      .finish()";
    code_ += "  }";
    code_ += "}";
    code_ += "";

    // Generate impls for SafeSliceAccess (because all structs are endian-safe),
    // Follow for the value type, Follow for the reference type, Push for the
    // value type, and Push for the reference type.
    code_ += "impl flatbuffers::SimpleToVerifyInSlice for {{STRUCT_TY}} {}";
    code_ += "impl<'a> flatbuffers::Follow<'a> for {{STRUCT_TY}} {";
    code_ += "  type Inner = &'a {{STRUCT_TY}};";
    code_ += "  #[inline]";
    code_ += "  unsafe fn follow(buf: &'a [u8], loc: usize) -> Self::Inner {";
    code_ += "    <&'a {{STRUCT_TY}}>::follow(buf, loc)";
    code_ += "  }";
    code_ += "}";
    code_ += "impl<'a> flatbuffers::Follow<'a> for &'a {{STRUCT_TY}} {";
    code_ += "  type Inner = &'a {{STRUCT_TY}};";
    code_ += "  #[inline]";
    code_ += "  unsafe fn follow(buf: &'a [u8], loc: usize) -> Self::Inner {";
    code_ += "    flatbuffers::follow_cast_ref::<{{STRUCT_TY}}>(buf, loc)";
    code_ += "  }";
    code_ += "}";
    code_ += "impl<'b> flatbuffers::Push for {{STRUCT_TY}} {";
    code_ += "    type Output = {{STRUCT_TY}};";
    code_ += "    #[inline]";
    code_ += "    unsafe fn push(&self, dst: &mut [u8], _written_len: usize) {";
    code_ +=
        "        let src = ::core::slice::from_raw_parts(self as *const "
        "{{STRUCT_TY}} as *const u8, Self::size());";
    code_ += "        dst.copy_from_slice(src);";
    code_ += "    }";
    code_ += "}";
    code_ += "";

    // Generate verifier: Structs are simple so presence and alignment are
    // all that need to be checked.
    code_ += "impl<'a> flatbuffers::Verifiable for {{STRUCT_TY}} {";
    code_ += "  #[inline]";
    code_ += "  fn run_verifier(";
    code_ += "    v: &mut flatbuffers::Verifier, pos: usize";
    code_ += "  ) -> Result<(), flatbuffers::InvalidFlatbuffer> {";
    code_ += "    use self::flatbuffers::Verifiable;";
    code_ += "    v.in_buffer::<Self>(pos)";
    code_ += "  }";
    code_ += "}";
    code_ += "";

    // Implement serde::Serialize
    if (parser_.opts.rust_serialize) {
      const auto numFields = struct_def.fields.vec.size();
      code_.SetValue("NUM_FIELDS", NumToString(numFields));
      code_ += "impl Serialize for {{STRUCT_TY}} {";
      code_ +=
          "  fn serialize<S>(&self, serializer: S) -> Result<S::Ok, S::Error>";
      code_ += "  where";
      code_ += "    S: Serializer,";
      code_ += "  {";
      if (numFields == 0) {
        code_ +=
            "    let s = serializer.serialize_struct(\"{{STRUCT_TY}}\", 0)?;";
      } else {
        code_ +=
            "    let mut s = serializer.serialize_struct(\"{{STRUCT_TY}}\", "
            "{{NUM_FIELDS}})?;";
      }
      ForAllStructFields(struct_def, [&](const FieldDef &unused) {
        (void)unused;
        code_ +=
            "    s.serialize_field(\"{{FIELD}}\", "
            "&self.{{FIELD}}())?;";
      });
      code_ += "    s.end()";
      code_ += "  }";
      code_ += "}";
      code_ += "";
    }

    // Generate a constructor that takes all fields as arguments.
    code_ += "impl<'a> {{STRUCT_TY}} {";
    code_ += "  #[allow(clippy::too_many_arguments)]";
    code_ += "  pub fn new(";
    ForAllStructFields(struct_def, [&](const FieldDef &unused) {
      (void)unused;
      code_ += "  {{FIELD}}: {{REF}}{{FIELD_TYPE}},";
    });
    code_ += "  ) -> Self {";
    code_ += "    let mut s = Self([0; {{STRUCT_SIZE}}]);";
    ForAllStructFields(struct_def, [&](const FieldDef &unused) {
      (void)unused;
      code_ += "  s.set_{{FIELD}}({{FIELD}});";
    });
    code_ += "    s";
    code_ += "  }";
    code_ += "";

    if (parser_.opts.generate_name_strings) {
      GenFullyQualifiedNameGetter(struct_def, struct_def.name);
    }

    // Generate accessor methods for the struct.
    ForAllStructFields(struct_def, [&](const FieldDef &field) {
      this->GenComment(field.doc_comment);
      // Getter.
      if (IsStruct(field.value.type)) {
        code_ += "pub fn {{FIELD}}(&self) -> &{{FIELD_TYPE}} {";
        code_ += "  // Safety:";
        code_ += "  // Created from a valid Table for this object";
        code_ += "  // Which contains a valid struct in this slot";
        code_ +=
            "  unsafe {"
            " &*(self.0[{{FIELD_OFFSET}}..].as_ptr() as *const"
            " {{FIELD_TYPE}}) }";
      } else if (IsArray(field.value.type)) {
        code_.SetValue("ARRAY_SIZE",
                       NumToString(field.value.type.fixed_length));
        code_.SetValue("ARRAY_ITEM", GetTypeGet(field.value.type.VectorType()));
        code_ +=
            "pub fn {{FIELD}}(&'a self) -> "
            "flatbuffers::Array<'a, {{ARRAY_ITEM}}, {{ARRAY_SIZE}}> {";
        code_ += "  // Safety:";
        code_ += "  // Created from a valid Table for this object";
        code_ += "  // Which contains a valid array in this slot";
        code_ +=
            "  unsafe { flatbuffers::Array::follow(&self.0, {{FIELD_OFFSET}}) "
            "}";
      } else {
        code_ += "pub fn {{FIELD}}(&self) -> {{FIELD_TYPE}} {";
        code_ +=
            "  let mut mem = core::mem::MaybeUninit::"
            "<<{{FIELD_TYPE}} as EndianScalar>::Scalar>::uninit();";
        code_ += "  // Safety:";
        code_ += "  // Created from a valid Table for this object";
        code_ += "  // Which contains a valid value in this slot";
        code_ += "  EndianScalar::from_little_endian(unsafe {";
        code_ += "    core::ptr::copy_nonoverlapping(";
        code_ += "      self.0[{{FIELD_OFFSET}}..].as_ptr(),";
        code_ += "      mem.as_mut_ptr() as *mut u8,";
        code_ +=
            "      core::mem::size_of::<<{{FIELD_TYPE}} as "
            "EndianScalar>::Scalar>(),";
        code_ += "    );";
        code_ += "    mem.assume_init()";
        code_ += "  })";
      }
      code_ += "}\n";
      // Setter.
      if (IsStruct(field.value.type)) {
        code_.SetValue("FIELD_SIZE", NumToString(InlineSize(field.value.type)));
        code_ += "#[allow(clippy::identity_op)]";  // If FIELD_OFFSET=0.
        code_ += "pub fn set_{{FIELD}}(&mut self, x: &{{FIELD_TYPE}}) {";
        code_ +=
            "  self.0[{{FIELD_OFFSET}}..{{FIELD_OFFSET}} + {{FIELD_SIZE}}]"
            ".copy_from_slice(&x.0)";
      } else if (IsArray(field.value.type)) {
        if (GetFullType(field.value.type) == ftArrayOfBuiltin) {
          code_.SetValue("ARRAY_ITEM",
                         GetTypeGet(field.value.type.VectorType()));
          code_.SetValue(
              "ARRAY_ITEM_SIZE",
              NumToString(InlineSize(field.value.type.VectorType())));
          code_ +=
              "pub fn set_{{FIELD}}(&mut self, items: &{{FIELD_TYPE}}) "
              "{";
          code_ += "  // Safety:";
          code_ += "  // Created from a valid Table for this object";
          code_ += "  // Which contains a valid array in this slot";
          code_ +=
              "  unsafe { flatbuffers::emplace_scalar_array(&mut self.0, "
              "{{FIELD_OFFSET}}, items) };";
        } else {
          code_.SetValue("FIELD_SIZE",
                         NumToString(InlineSize(field.value.type)));
          code_ += "pub fn set_{{FIELD}}(&mut self, x: &{{FIELD_TYPE}}) {";
          code_ += "  // Safety:";
          code_ += "  // Created from a valid Table for this object";
          code_ += "  // Which contains a valid array in this slot";
          code_ += "  unsafe {";
          code_ += "    core::ptr::copy(";
          code_ += "      x.as_ptr() as *const u8,";
          code_ += "      self.0.as_mut_ptr().add({{FIELD_OFFSET}}),";
          code_ += "      {{FIELD_SIZE}},";
          code_ += "    );";
          code_ += "  }";
        }
      } else {
        code_ += "pub fn set_{{FIELD}}(&mut self, x: {{FIELD_TYPE}}) {";
        code_ += "  let x_le = x.to_little_endian();";
        code_ += "  // Safety:";
        code_ += "  // Created from a valid Table for this object";
        code_ += "  // Which contains a valid value in this slot";
        code_ += "  unsafe {";
        code_ += "    core::ptr::copy_nonoverlapping(";
        code_ += "      &x_le as *const _ as *const u8,";
        code_ += "      self.0[{{FIELD_OFFSET}}..].as_mut_ptr(),";
        code_ +=
            "      core::mem::size_of::<<{{FIELD_TYPE}} as "
            "EndianScalar>::Scalar>(),";
        code_ += "    );";
        code_ += "  }";
      }
      code_ += "}\n";

      // Generate a comparison function for this field if it is a key.
      if (field.key) { GenKeyFieldMethods(field); }
    });

    // Generate Object API unpack method.
    if (parser_.opts.generate_object_based_api) {
      code_.SetValue("STRUCT_OTY", namer_.ObjectType(struct_def));
      code_ += "  pub fn unpack(&self) -> {{STRUCT_OTY}} {";
      code_ += "    {{STRUCT_OTY}} {";
      ForAllStructFields(struct_def, [&](const FieldDef &field) {
        if (IsArray(field.value.type)) {
          if (GetFullType(field.value.type) == ftArrayOfStruct) {
            code_ +=
                "    {{FIELD}}: { let {{FIELD}} = "
                "self.{{FIELD}}(); flatbuffers::array_init(|i| "
                "{{FIELD}}.get(i).unpack()) },";
          } else {
            code_ += "    {{FIELD}}: self.{{FIELD}}().into(),";
          }
        } else {
          std::string unpack = IsStruct(field.value.type) ? ".unpack()" : "";
          code_ += "    {{FIELD}}: self.{{FIELD}}()" + unpack + ",";
        }
      });
      code_ += "    }";
      code_ += "  }";
    }

    code_ += "}";  // End impl Struct methods.
    code_ += "";

    // Generate Struct Object.
    if (parser_.opts.generate_object_based_api) {
      // Struct declaration
      code_ += "#[derive(Debug, Clone, PartialEq, Default)]";
      code_ += "{{ACCESS_TYPE}} struct {{STRUCT_OTY}} {";
      ForAllStructFields(struct_def, [&](const FieldDef &field) {
        (void)field;  // unused.
        code_ += "pub {{FIELD}}: {{FIELD_OTY}},";
      });
      code_ += "}";
      // The `pack` method that turns the native struct into its Flatbuffers
      // counterpart.
      code_ += "impl {{STRUCT_OTY}} {";
      code_ += "  pub fn pack(&self) -> {{STRUCT_TY}} {";
      code_ += "    {{STRUCT_TY}}::new(";
      ForAllStructFields(struct_def, [&](const FieldDef &field) {
        if (IsStruct(field.value.type)) {
          code_ += "    &self.{{FIELD}}.pack(),";
        } else if (IsArray(field.value.type)) {
          if (GetFullType(field.value.type) == ftArrayOfStruct) {
            code_ +=
                "    &flatbuffers::array_init(|i| "
                "self.{{FIELD}}[i].pack()),";
          } else {
            code_ += "    &self.{{FIELD}},";
          }
        } else {
          code_ += "    self.{{FIELD}},";
        }
      });
      code_ += "    )";
      code_ += "  }";
      code_ += "}";
      code_ += "";
    }
  }